

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cc
# Opt level: O0

size_t __thiscall
google::protobuf::internal::UntypedMapBase::SpaceUsedExcludingSelfLong(UntypedMapBase *this)

{
  size_t local_18;
  size_t size;
  UntypedMapBase *this_local;
  
  local_18 = (ulong)((uint)(this->type_info_).node_size * this->num_elements_) +
             (ulong)this->num_buckets_ * 8;
  size = (size_t)this;
  VisitAllNodes<google::protobuf::internal::UntypedMapBase::SpaceUsedExcludingSelfLong()const::__0>
            (this,(anon_class_8_1_89918cff)&local_18);
  return local_18;
}

Assistant:

size_t UntypedMapBase::SpaceUsedExcludingSelfLong() const {
  size_t size = 0;
  // The size of the table.
  size += sizeof(void*) * num_buckets_;
  // All the nodes.
  size += type_info_.node_size * num_elements_;
  VisitAllNodes([&](auto* key, auto* value) {
    const auto space_used = absl::Overload{
        [](const std::string* str) -> size_t {
          return StringSpaceUsedExcludingSelfLong(*str);
        },
        [&](const MessageLite* msg) -> size_t {
          const auto* class_data = GetClassData(*msg);
          if (class_data->is_lite) return 0;
          return class_data->full().descriptor_methods->space_used_long(*msg) -
                 class_data->allocation_size();
        },
        [](const void*) -> size_t { return 0; }};
    size += space_used(key);
    size += space_used(value);
  });
  return size;
}